

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPchHeader
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  _Base_ptr *pp_Var1;
  char cVar2;
  cmMakefile *pcVar3;
  cmGeneratorTarget *this_00;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  Encoding encoding;
  cmValue cVar9;
  string *psVar10;
  mapped_type *args_1;
  cmValue cVar11;
  ostream *poVar12;
  long lVar13;
  _Base_ptr destination;
  char *pcVar14;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *header_bt;
  pointer filename;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar15;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator<char> local_3dd;
  undefined4 local_3dc;
  cmGeneratorTarget *local_3d8;
  string *local_3d0;
  _Base_ptr local_3c8;
  string firstHeaderOnDisk;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  languageToExtension;
  string filename_tmp;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  string local_308;
  cmGeneratedFileStream file;
  string local_80;
  cmAlphaNum local_60;
  
  local_3d0 = arch;
  bVar7 = std::operator!=(language,"C");
  if ((((bVar7) && (bVar7 = std::operator!=(language,"CXX"), bVar7)) &&
      (bVar7 = std::operator!=(language,"OBJC"), bVar7)) &&
     (bVar7 = std::operator!=(language,"OBJCXX"), bVar7)) {
LAB_0034617d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,"DISABLE_PRECOMPILE_HEADERS",(allocator<char> *)&languageToExtension);
  bVar7 = GetPropertyAsBool(this,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  if (bVar7) goto LAB_0034617d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,"PRECOMPILE_HEADERS_REUSE_FROM",(allocator<char> *)&languageToExtension
            );
  cVar9 = GetProperty(this,(string *)&file);
  std::__cxx11::string::~string((string *)&file);
  std::operator+(&firstHeaderOnDisk,language,config);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &languageToExtension,&firstHeaderOnDisk,local_3d0);
  uVar5 = languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  pp_Var1 = &languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)languageToExtension._M_t._M_impl._0_8_ == pp_Var1) {
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
         languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)languageToExtension._M_t._M_impl._0_8_;
  }
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  uVar6 = languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar5;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar5,4);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
       languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
       languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
       (long)"PK\x01\x02" + 4;
  languageToExtension._M_t._M_impl._0_8_ = pp_Var1;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar6;
  pVar15 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->PchHeaders,
                      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                       *)&file);
  local_3c8 = (_Base_ptr)pVar15.first._M_node;
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&languageToExtension);
  std::__cxx11::string::~string((string *)&firstHeaderOnDisk);
  if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto LAB_0034696b;
  GetPrecompileHeaders(&headers,this,config,language);
  p_Var4 = local_3c8;
  if (headers.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      headers.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (cVar9.Value == (string *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&headers);
      return __return_storage_ptr__;
    }
LAB_003462e2:
    local_3d8 = cmGlobalGenerator::FindGeneratorTarget
                          (this->LocalGenerator->GlobalGenerator,cVar9.Value);
    local_3dc = (undefined4)CONCAT71((int7)((ulong)local_3d8 >> 8),1);
  }
  else {
    if (cVar9.Value != (string *)0x0) goto LAB_003462e2;
    local_3dc = 0;
    local_3d8 = this;
  }
  destination = p_Var4 + 2;
  psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_3d8->LocalGenerator);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar10->_M_dataplus)._M_p;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)psVar10->_M_string_length;
  languageToExtension._M_t._M_impl._0_8_ = 1;
  languageToExtension._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
  cmStrCat<>(&firstHeaderOnDisk,(cmAlphaNum *)&file,(cmAlphaNum *)&languageToExtension);
  std::__cxx11::string::operator=((string *)destination,(string *)&firstHeaderOnDisk);
  std::__cxx11::string::~string((string *)&firstHeaderOnDisk);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file,(char (*) [2])0x598b6b,(char (*) [3])0x5c707b);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x40,
             (char (*) [4])0x586137,(char (*) [5])0x5c7085);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[8],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x80,
             (char (*) [5])"OBJC",(char (*) [8])".objc.h");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xc0,
             (char (*) [7])"OBJCXX",(char (*) [12])".objcxx.hxx");
  __l._M_len = 4;
  __l._M_array = (iterator)&file;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&languageToExtension,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &firstHeaderOnDisk,(allocator_type *)&filename_tmp);
  this_00 = local_3d8;
  lVar13 = 0xc0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       _vptr_basic_ostream + lVar13));
    lVar13 = lVar13 + -0x40;
  } while (lVar13 != -0x40);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
       destination->_M_color;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
       *(undefined4 *)&destination->field_0x4;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)p_Var4[2]._M_parent;
  firstHeaderOnDisk._M_dataplus._M_p = &DAT_0000000b;
  firstHeaderOnDisk._M_string_length = (long)"**/CMakeFiles/" + 3;
  psVar10 = GetName_abi_cxx11_(this_00);
  cmStrCat<std::__cxx11::string,char[5]>
            (&filename_tmp,(cmAlphaNum *)&file,(cmAlphaNum *)&firstHeaderOnDisk,psVar10,
             (char (*) [5])0x5ce592);
  std::__cxx11::string::operator=((string *)destination,(string *)&filename_tmp);
  std::__cxx11::string::~string((string *)&filename_tmp);
  iVar8 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar8 != '\0') {
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
         destination->_M_color;
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
         *(undefined4 *)&destination->field_0x4;
    file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)p_Var4[2]._M_parent;
    firstHeaderOnDisk._M_dataplus._M_p = (pointer)0x1;
    firstHeaderOnDisk._M_string_length =
         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
    cmStrCat<std::__cxx11::string>
              (&filename_tmp,(cmAlphaNum *)&file,(cmAlphaNum *)&firstHeaderOnDisk,config);
    std::__cxx11::string::operator=((string *)destination,(string *)&filename_tmp);
    std::__cxx11::string::~string((string *)&filename_tmp);
  }
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
       destination->_M_color;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
       *(undefined4 *)&destination->field_0x4;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)p_Var4[2]._M_parent;
  firstHeaderOnDisk._M_dataplus._M_p = (pointer)0xa;
  firstHeaderOnDisk._M_string_length = (long)".dir/cmake_pch" + 4;
  local_3d8 = (cmGeneratorTarget *)__return_storage_ptr__;
  if (local_3d0->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"",&local_3dd);
  }
  else {
    filename_tmp._M_dataplus._M_p = (pointer)0x1;
    filename_tmp._M_string_length = (long)"._" + 1;
    local_60.View_._M_str = (local_3d0->_M_dataplus)._M_p;
    local_60.View_._M_len = local_3d0->_M_string_length;
    cmStrCat<>(&local_308,(cmAlphaNum *)&filename_tmp,&local_60);
  }
  args_1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&languageToExtension,language);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (&local_80,(cmAlphaNum *)&file,(cmAlphaNum *)&firstHeaderOnDisk,&local_308,args_1);
  std::__cxx11::string::operator=((string *)destination,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_308);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_4_ =
       destination->_M_color;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._12_4_ =
       *(undefined4 *)&destination->field_0x4;
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)p_Var4[2]._M_parent;
  firstHeaderOnDisk._M_dataplus._M_p = (pointer)0x4;
  firstHeaderOnDisk._M_string_length = (long)"%s.%s.tmp" + 5;
  cmStrCat<>(&filename_tmp,(cmAlphaNum *)&file,(cmAlphaNum *)&firstHeaderOnDisk);
  __return_storage_ptr__ = (string *)local_3d8;
  if ((char)local_3dc == '\0') {
    pcVar3 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"CMAKE_PCH_PROLOGUE",(allocator<char> *)&firstHeaderOnDisk);
    cVar9 = cmMakefile::GetDefinition(pcVar3,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    pcVar3 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"CMAKE_PCH_EPILOGUE",(allocator<char> *)&firstHeaderOnDisk);
    cVar11 = cmMakefile::GetDefinition(pcVar3,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    firstHeaderOnDisk._M_dataplus._M_p = (pointer)&firstHeaderOnDisk.field_2;
    firstHeaderOnDisk._M_string_length = 0;
    firstHeaderOnDisk.field_2._M_local_buf[0] = '\0';
    encoding = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&file,&filename_tmp,false,encoding);
    std::operator<<((ostream *)&file,"/* generated by CMake */\n\n");
    if (cVar9.Value != (string *)0x0) {
      poVar12 = std::operator<<((ostream *)&file,(string *)cVar9.Value);
      std::operator<<(poVar12,"\n");
    }
    iVar8 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
    if ((char)iVar8 != '\0') {
      std::operator<<((ostream *)&file,"#ifndef CMAKE_SKIP_PRECOMPILE_HEADERS\n");
    }
    bVar7 = std::operator==(language,"CXX");
    if ((bVar7) &&
       (iVar8 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(),
       (char)iVar8 == '\0')) {
      std::operator<<((ostream *)&file,"#ifdef __cplusplus\n");
    }
    local_3d0 = cVar11.Value;
    for (filename = headers.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        filename !=
        headers.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; filename = filename + 1) {
      if ((filename->Value)._M_string_length != 0) {
        cVar2 = *(filename->Value)._M_dataplus._M_p;
        if ((cVar2 == '<') || (cVar2 == '\"')) {
          poVar12 = std::operator<<((ostream *)&file,"#include ");
          poVar12 = std::operator<<(poVar12,(string *)filename);
          pcVar14 = "\n";
        }
        else {
          poVar12 = std::operator<<((ostream *)&file,"#include \"");
          poVar12 = std::operator<<(poVar12,(string *)filename);
          pcVar14 = "\"\n";
        }
        std::operator<<(poVar12,pcVar14);
        bVar7 = cmsys::SystemTools::FileExists(&filename->Value);
        if (bVar7 && firstHeaderOnDisk._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&firstHeaderOnDisk);
        }
      }
    }
    bVar7 = std::operator==(language,"CXX");
    psVar10 = local_3d0;
    if ((bVar7) &&
       (iVar8 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(),
       (char)iVar8 == '\0')) {
      std::operator<<((ostream *)&file,"#endif // __cplusplus\n");
    }
    iVar8 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
    if ((char)iVar8 != '\0') {
      std::operator<<((ostream *)&file,"#endif // CMAKE_SKIP_PRECOMPILE_HEADERS\n");
    }
    if (psVar10 != (string *)0x0) {
      poVar12 = std::operator<<((ostream *)&file,(string *)psVar10);
      std::operator<<(poVar12,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&file);
    __return_storage_ptr__ = (string *)local_3d8;
    if (firstHeaderOnDisk._M_string_length != 0) {
      cmFileTimes::Copy(&firstHeaderOnDisk,&filename_tmp);
    }
    cmSystemTools::MoveFileIfDifferent(&filename_tmp,(string *)destination);
    std::__cxx11::string::~string((string *)&firstHeaderOnDisk);
  }
  std::__cxx11::string::~string((string *)&filename_tmp);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&languageToExtension._M_t);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&headers);
LAB_0034696b:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_3c8 + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchHeader(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }

  if (this->GetPropertyAsBool("DISABLE_PRECOMPILE_HEADERS")) {
    return std::string();
  }
  const cmGeneratorTarget* generatorTarget = this;
  cmValue pchReuseFrom =
    generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");

  const auto inserted =
    this->PchHeaders.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::vector<BT<std::string>> headers =
      this->GetPrecompileHeaders(config, language);
    if (headers.empty() && !pchReuseFrom) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename = cmStrCat(
      generatorTarget->LocalGenerator->GetCurrentBinaryDirectory(), "/");

    const std::map<std::string, std::string> languageToExtension = {
      { "C", ".h" },
      { "CXX", ".hxx" },
      { "OBJC", ".objc.h" },
      { "OBJCXX", ".objcxx.hxx" }
    };

    filename =
      cmStrCat(filename, "CMakeFiles/", generatorTarget->GetName(), ".dir");

    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      filename = cmStrCat(filename, "/", config);
    }

    filename =
      cmStrCat(filename, "/cmake_pch", arch.empty() ? "" : cmStrCat("_", arch),
               languageToExtension.at(language));

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      cmValue pchPrologue =
        this->Makefile->GetDefinition("CMAKE_PCH_PROLOGUE");
      cmValue pchEpilogue =
        this->Makefile->GetDefinition("CMAKE_PCH_EPILOGUE");

      std::string firstHeaderOnDisk;
      {
        cmGeneratedFileStream file(
          filename_tmp, false,
          this->GetGlobalGenerator()->GetMakefileEncoding());
        file << "/* generated by CMake */\n\n";
        if (pchPrologue) {
          file << *pchPrologue << "\n";
        }
        if (this->GetGlobalGenerator()->IsXcode()) {
          file << "#ifndef CMAKE_SKIP_PRECOMPILE_HEADERS\n";
        }
        if (language == "CXX" && !this->GetGlobalGenerator()->IsXcode()) {
          file << "#ifdef __cplusplus\n";
        }
        for (auto const& header_bt : headers) {
          if (header_bt.Value.empty()) {
            continue;
          }
          if (header_bt.Value[0] == '<' || header_bt.Value[0] == '\"') {
            file << "#include " << header_bt.Value << "\n";
          } else {
            file << "#include \"" << header_bt.Value << "\"\n";
          }

          if (cmSystemTools::FileExists(header_bt.Value) &&
              firstHeaderOnDisk.empty()) {
            firstHeaderOnDisk = header_bt.Value;
          }
        }
        if (language == "CXX" && !this->GetGlobalGenerator()->IsXcode()) {
          file << "#endif // __cplusplus\n";
        }
        if (this->GetGlobalGenerator()->IsXcode()) {
          file << "#endif // CMAKE_SKIP_PRECOMPILE_HEADERS\n";
        }
        if (pchEpilogue) {
          file << *pchEpilogue << "\n";
        }
      }

      if (!firstHeaderOnDisk.empty()) {
        cmFileTimes::Copy(firstHeaderOnDisk, filename_tmp);
      }

      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}